

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

MockSpec<void_(const_int_&)> * __thiscall
testing::internal::FunctionMocker<void_(const_int_&)>::With
          (MockSpec<void_(const_int_&)> *__return_storage_ptr__,
          FunctionMocker<void_(const_int_&)> *this,Matcher<const_int_&> *m)

{
  tuple<testing::Matcher<const_int_&>_> local_38;
  Matcher<const_int_&> *local_20;
  Matcher<const_int_&> *m_local;
  FunctionMocker<void_(const_int_&)> *this_local;
  
  local_20 = m;
  m_local = (Matcher<const_int_&> *)this;
  this_local = (FunctionMocker<void_(const_int_&)> *)__return_storage_ptr__;
  std::make_tuple<testing::Matcher<int_const&>>(&local_38,m);
  MockSpec<void_(const_int_&)>::MockSpec(__return_storage_ptr__,this,&local_38);
  std::tuple<testing::Matcher<const_int_&>_>::~tuple(&local_38);
  return __return_storage_ptr__;
}

Assistant:

MockSpec<F> With(Matcher<Args>... m) {
    return MockSpec<F>(this, ::std::make_tuple(std::move(m)...));
  }